

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O0

void __thiscall Complex::buyOption(Complex *this,AsianGeometricPut *option,double *multiplier)

{
  double dVar1;
  double *pdVar2;
  double local_68 [3];
  double local_50;
  undefined1 local_48 [8];
  AsianGeometricPut new_option;
  double *multiplier_local;
  AsianGeometricPut *option_local;
  Complex *this_local;
  
  new_option.super_PathDependentOption._32_8_ = multiplier;
  AsianGeometricPut::AsianGeometricPut((AsianGeometricPut *)local_48,option);
  dVar1 = *(double *)new_option.super_PathDependentOption._32_8_;
  local_50 = Option::getMultiplier((Option *)local_48);
  local_50 = dVar1 * local_50;
  Option::setMultiplier((Option *)local_48,&local_50);
  std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>::push_back
            (&this->asian_geometric_put,(value_type *)local_48);
  local_68[0] = Option::getMaturity((Option *)local_48);
  pdVar2 = std::max<double>(&this->max_T,local_68);
  this->max_T = *pdVar2;
  AsianGeometricPut::~AsianGeometricPut((AsianGeometricPut *)local_48);
  return;
}

Assistant:

void Complex::buyOption(AsianGeometricPut const& option, double const& multiplier)
{
	AsianGeometricPut new_option = AsianGeometricPut(option);
	new_option.setMultiplier(multiplier * new_option.getMultiplier());
	asian_geometric_put.push_back(new_option);
	max_T = std::max(max_T, new_option.getMaturity());
}